

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O2

void __thiscall icu_63::RBBISetBuilder::buildTrie(RBBISetBuilder *this)

{
  RangeDescriptor *pRVar1;
  UTrie2 *pUVar2;
  RangeDescriptor **ppRVar3;
  
  pUVar2 = utrie2_open_63(0,0,this->fStatus);
  this->fTrie = pUVar2;
  ppRVar3 = &this->fRangeList;
  while ((pRVar1 = *ppRVar3, pRVar1 != (RangeDescriptor *)0x0 &&
         (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR))) {
    utrie2_setRange32_63
              (this->fTrie,pRVar1->fStartChar,pRVar1->fEndChar,pRVar1->fNum,'\x01',this->fStatus);
    ppRVar3 = &pRVar1->fNext;
  }
  return;
}

Assistant:

void RBBISetBuilder::buildTrie() {
    RangeDescriptor *rlRange;

    fTrie = utrie2_open(0,       //  Initial value for all code points.
                        0,       //  Error value for out-of-range input.
                        fStatus);

    for (rlRange = fRangeList; rlRange!=0 && U_SUCCESS(*fStatus); rlRange=rlRange->fNext) {
        utrie2_setRange32(fTrie,
                          rlRange->fStartChar,     // Range start
                          rlRange->fEndChar,       // Range end (inclusive)
                          rlRange->fNum,           // value for range
                          TRUE,                    // Overwrite previously written values
                          fStatus);
    }
}